

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

int Cut_CutListVerify(Cut_Cut_t *pList)

{
  int iVar1;
  Cut_Cut_t *local_28;
  Cut_Cut_t *pDom;
  Cut_Cut_t *pCut;
  Cut_Cut_t *pList_local;
  
  pDom = pList;
  do {
    local_28 = pList;
    if (pDom == (Cut_Cut_t *)0x0) {
      return 1;
    }
    for (; local_28 != pDom; local_28 = local_28->pNext) {
      iVar1 = Cut_CutCheckDominance(local_28,pDom);
      if (iVar1 != 0) {
        printf("******************* These are contained cuts:\n");
        Cut_CutPrint(local_28,1);
        Cut_CutPrint(local_28,1);
        return 0;
      }
    }
    pDom = pDom->pNext;
  } while( true );
}

Assistant:

int Cut_CutListVerify( Cut_Cut_t * pList )
{ 
    Cut_Cut_t * pCut, * pDom;
    Cut_ListForEachCut( pList, pCut )
    {
        Cut_ListForEachCutStop( pList, pDom, pCut )
        {
            if ( Cut_CutCheckDominance( pDom, pCut ) )
            {
                printf( "******************* These are contained cuts:\n" );
                Cut_CutPrint( pDom, 1 );
                Cut_CutPrint( pDom, 1 );
                return 0;
            }
        }
    }
    return 1;
}